

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void __thiscall despot::VNode::PrintTree(VNode *this,int depth,ostream *os)

{
  QNode *pQVar1;
  double dVar2;
  ostream *poVar3;
  pointer ppQVar4;
  _Rb_tree_node_base *p_Var5;
  mapped_type *ppVVar6;
  unsigned_long *puVar7;
  unsigned_long *puVar8;
  _Self __tmp;
  ulong uVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> labels;
  unsigned_long *local_b8;
  unsigned_long *puStack_b0;
  unsigned_long *local_a8;
  string local_98;
  string local_78;
  string local_58;
  ulong local_38;
  
  if (this->depth_ <= depth || depth == -1) {
    if (this->depth_ == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"d - default value",0x11);
      std::ios::widen((char)os->_vptr_basic_ostream[-3] + (char)os);
      std::ostream::put((char)os);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"l - lower bound",0xf);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"u - upper bound",0xf);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"r - totol weighted one step reward",0x22);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"w - total particle weight",0x19);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
    std::__ostream_insert<char,std::char_traits<char>>(os,"d:",2);
    poVar3 = std::ostream::_M_insert<double>((this->default_move_).value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," l:",3);
    poVar3 = std::ostream::_M_insert<double>(this->lower_bound_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", u:",4);
    poVar3 = std::ostream::_M_insert<double>(this->upper_bound_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", w:",4);
    dVar2 = State::Weight(&this->particles_);
    poVar3 = std::ostream::_M_insert<double>(dVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", weu:",6);
    dVar2 = DESPOT::WEU(this);
    poVar3 = std::ostream::_M_insert<double>(dVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    ppQVar4 = (this->children_).
              super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->children_).super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppQVar4) {
      local_38 = 0;
      do {
        pQVar1 = ppQVar4[local_38];
        local_b8 = (unsigned_long *)0x0;
        puStack_b0 = (unsigned_long *)0x0;
        local_a8 = (unsigned_long *)0x0;
        for (p_Var5 = (pQVar1->children_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != &(pQVar1->children_)._M_t._M_impl.super__Rb_tree_header;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          if (puStack_b0 == local_a8) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,
                       (iterator)puStack_b0,(unsigned_long *)(p_Var5 + 1));
          }
          else {
            *puStack_b0 = *(unsigned_long *)(p_Var5 + 1);
            puStack_b0 = puStack_b0 + 1;
          }
        }
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"|   ","");
        repeat(&local_98,&local_58,this->depth_);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_98._M_dataplus._M_p,local_98._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"a=",2);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pQVar1->edge_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(d:",3);
        poVar3 = std::ostream::_M_insert<double>(pQVar1->default_value);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", l:",4);
        poVar3 = std::ostream::_M_insert<double>(pQVar1->lower_bound_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", u:",4);
        poVar3 = std::ostream::_M_insert<double>(pQVar1->upper_bound_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", r:",4);
        poVar3 = std::ostream::_M_insert<double>(pQVar1->step_reward);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
        std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        puVar8 = local_b8;
        if (puStack_b0 != local_b8) {
          uVar9 = 0;
          puVar7 = puStack_b0;
          do {
            if ((depth == -1) || (this->depth_ < depth)) {
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"|   ","");
              repeat(&local_98,&local_78,this->depth_);
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 (os,local_98._M_dataplus._M_p,local_98._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"| o=",4);
              poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              local_98._M_dataplus._M_p = (pointer)local_b8[uVar9];
              ppVVar6 = std::
                        map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                        ::operator[](&pQVar1->children_,(key_type *)&local_98);
              PrintTree(*ppVVar6,depth,os);
              puVar7 = puStack_b0;
              puVar8 = local_b8;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < (ulong)((long)puVar7 - (long)puVar8 >> 3));
        }
        uVar9 = local_38;
        if (puVar8 != (unsigned_long *)0x0) {
          operator_delete(puVar8,(long)local_a8 - (long)puVar8);
        }
        local_38 = uVar9 + 1;
        ppQVar4 = (this->children_).
                  super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (local_38 <
               (ulong)((long)(this->children_).
                             super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppQVar4 >> 3));
    }
  }
  return;
}

Assistant:

void VNode::PrintTree(int depth, ostream& os) {
	if (depth != -1 && this->depth() > depth)
		return;

	if (this->depth() == 0) {
		os << "d - default value" << endl
			<< "l - lower bound" << endl
			<< "u - upper bound" << endl
			<< "r - totol weighted one step reward" << endl
			<< "w - total particle weight" << endl;
	}

	os << "(" << "d:" << this->default_move().value <<
		" l:" << this->lower_bound() << ", u:" << this->upper_bound()
		<< ", w:" << this->Weight() << ", weu:" << DESPOT::WEU(this)
		<< ")"
		<< endl;


	vector<QNode*>& qnodes = children();
	for (int a = 0; a < qnodes.size(); a++) {
		QNode* qnode = qnodes[a];

		vector<OBS_TYPE> labels;
		map<OBS_TYPE, VNode*>& vnodes = qnode->children();
		for (map<OBS_TYPE, VNode*>::iterator it = vnodes.begin();
			it != vnodes.end(); it++) {
			labels.push_back(it->first);
		}

		os << repeat("|   ", this->depth()) << "a="
			<< qnode->edge() << ": "
			<< "(d:" << qnode->default_value << ", l:" << qnode->lower_bound()
			<< ", u:" << qnode->upper_bound()
			<< ", r:" << qnode->step_reward << ")" << endl;

		for (int i = 0; i < labels.size(); i++) {
			if (depth == -1 || this->depth() + 1 <= depth) {
				os << repeat("|   ", this->depth()) << "| o=" << labels[i]
					<< ": ";
				qnode->Child(labels[i])->PrintTree(depth, os);
			}
		}
	}
}